

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * AlphaVectorPlanning::GetDuplicateIndices(VectorSet *V)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pdVar4;
  reference pvVar5;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RSI;
  int __x;
  vector<int,_std::allocator<int>_> *in_RDI;
  int s;
  int j;
  int i;
  bool equal;
  int nrS;
  int nrInV;
  vector<int,_std::allocator<int>_> *duplicates;
  double in_stack_ffffffffffffff80;
  allocator_type *in_stack_ffffffffffffff88;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *this;
  int local_40;
  int local_3c;
  int local_38;
  
  this = in_RDI;
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(in_RSI);
  sVar3 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size2(in_RSI);
  std::allocator<int>::allocator((allocator<int> *)0x908e63);
  std::vector<int,_std::allocator<int>_>::vector
            (this,in_stack_ffffffffffffff98,(value_type_conflict4 *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  std::allocator<int>::~allocator((allocator<int> *)0x908e88);
  local_38 = 1;
  do {
    if (local_38 == (int)sVar2) {
      return this;
    }
    for (local_3c = 0; local_3c != local_38; local_3c = local_3c + 1) {
      bVar1 = true;
      for (local_40 = 0; local_40 != (int)sVar3; local_40 = local_40 + 1) {
        pdVar4 = boost::numeric::ublas::
                 matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::operator()(in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
                              (size_type)in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff88 = (allocator_type *)*pdVar4;
        __x = (int)in_RSI;
        in_stack_ffffffffffffff90 =
             (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)boost::numeric::ublas::
                matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                ::operator()(in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
                             (size_type)in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff80 =
             (double)in_stack_ffffffffffffff88 - (double)in_stack_ffffffffffffff90->size1_;
        std::abs(__x);
        if (1e-12 < in_stack_ffffffffffffff80) {
          bVar1 = false;
          break;
        }
      }
      if (bVar1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_38);
        *pvVar5 = local_3c;
        break;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

vector<int> AlphaVectorPlanning::GetDuplicateIndices(const VectorSet &V)
{
    int nrInV=V.size1(), nrS=V.size2();
    bool equal;

    vector<int> duplicates(nrInV,-1);

    for(int i=1;i!=nrInV;++i) // start at 1, first is never a duplicate
    {
        for(int j=0;j!=i;++j) // loop over all previous vectors
        {
            equal=true;
            for(int s=0;s!=nrS;++s)
            {
                if(abs(V(i,s)-V(j,s))>PROB_PRECISION)
                {
                    equal=false;
                    break; // if 1 number differs, they are not equal
                }
            }
            if(equal)
            {
                duplicates[i]=j;
                break; // we need to find only the first duplicate
            }
        }
    }

#if 0 // reduce verbosity
    PrintVectorCout(duplicates); cout << endl;
#endif
    return(duplicates);
}